

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::tls12_add_verify_sigalgs(SSL_HANDSHAKE *hs,CBB *out)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  uint16_t *puVar4;
  bool bVar5;
  
  sVar3 = (hs->config->verify_sigalgs).size_;
  if (sVar3 == 0) {
    puVar4 = &kVerifySignatureAlgorithms;
    sVar3 = 9;
  }
  else {
    puVar4 = (hs->config->verify_sigalgs).data_;
  }
  iVar1 = CBB_add_u16(out,*puVar4);
  if (iVar1 == 0) {
    bVar5 = false;
  }
  else {
    lVar2 = 2;
    do {
      bVar5 = sVar3 * 2 == lVar2;
      if (bVar5) {
        return bVar5;
      }
      iVar1 = CBB_add_u16(out,*(uint16_t *)((long)puVar4 + lVar2));
      lVar2 = lVar2 + 2;
    } while (iVar1 != 0);
  }
  return bVar5;
}

Assistant:

bool tls12_add_verify_sigalgs(const SSL_HANDSHAKE *hs, CBB *out) {
  for (uint16_t sigalg : tls12_get_verify_sigalgs(hs)) {
    if (!CBB_add_u16(out, sigalg)) {
      return false;
    }
  }
  return true;
}